

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_c1df::read_modern_mmap_range_prealloc
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          char *file_name)

{
  size_type __n;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  path local_58;
  undefined1 local_30 [8];
  mmap_file file;
  char *file_name_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *output;
  
  file.mmap_.size_ = (off_t)file_name;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_58,(char **)&file.mmap_.size_,auto_format);
  io::posix::mmap_file::mmap_file((mmap_file *)local_30,&local_58,read_only,owner_read|owner_write);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  __n = io::posix::mmap_file::size((mmap_file *)local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(__return_storage_ptr__,__n);
  __first = std::begin<io::posix::mmap_file>((mmap_file *)local_30);
  __last = std::end<io::posix::mmap_file>((mmap_file *)local_30);
  __result = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       (__return_storage_ptr__);
  std::
  copy<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (__first,__last,__result);
  io::posix::mmap_file::~mmap_file((mmap_file *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint8_t> read_modern_mmap_range_prealloc(const char* file_name)
{
    auto file = io::posix::mmap_file{file_name, io::open_mode::read_only};
    std::vector<std::uint8_t> output;
    output.reserve(file.size());
    std::copy(std::begin(file), std::end(file), std::back_inserter(output));
    return output;
}